

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O0

int mmk_streq(char *src,char *ref)

{
  bool bVar1;
  char *local_20;
  char *ref_local;
  char *src_local;
  
  local_20 = ref;
  ref_local = src;
  while( true ) {
    bVar1 = false;
    if (*ref_local != '\0') {
      bVar1 = *local_20 != '\0';
    }
    if (!bVar1) break;
    if (*ref_local != *local_20) {
      return 0;
    }
    ref_local = ref_local + 1;
    local_20 = local_20 + 1;
  }
  return (uint)(*local_20 == *ref_local);
}

Assistant:

int mmk_streq(const char *src, const char *ref)
{
    for (; *src && *ref; ++src, ++ref) {
        if (*src != *ref)
            return 0;
    }
    return *ref == *src;
}